

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Decrement_Numeric(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    pvVar2 = JavascriptBigInt::Decrement(aRight);
    return pvVar2;
  }
  pvVar2 = Subtract(aRight,&DAT_1000000000001,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Decrement_Numeric(Var aRight, ScriptContext* scriptContext)
        {
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Decrement(aRight);
            }
            return JavascriptMath::Subtract(aRight, TaggedInt::ToVarUnchecked(1), scriptContext);
        }